

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkcell.c
# Opt level: O2

LispPTR N_OP_createcell(LispPTR tos)

{
  int *piVar1;
  DLword *pDVar2;
  LispPTR LVar3;
  uint uVar4;
  LispPTR *base;
  ulong uVar5;
  DLword *pDVar6;
  uint ptr;
  uint uVar7;
  
  pDVar2 = DTDspace;
  if ((tos & 0xfff0000) == 0xe0000) {
    uVar7 = (tos & 0xffff) << 5;
    if (*(short *)((long)DTDspace + (ulong)(ushort)tos * 4 + (ulong)uVar7 + 4) != 0) {
      uVar5 = (ulong)((tos & 0xffff) + (tos & 0xffff));
      while( true ) {
        pDVar6 = Lisp_world;
        ptr = *(uint *)((long)pDVar2 + uVar5 * 2 + (ulong)uVar7 + 8) & 0xfffffff;
        if (ptr != 0) break;
        base = alloc_mdspage(*(short *)((long)pDVar2 + uVar5 * 2 + (ulong)uVar7 + 0x22));
        LVar3 = initmdspage(base,*(DLword *)((long)pDVar2 + uVar5 * 2 + (ulong)uVar7 + 4),0);
        *(LispPTR *)((long)pDVar2 + uVar5 * 2 + (ulong)uVar7 + 8) = LVar3;
        if ((LVar3 >> 0x1b & 1) != 0) {
          error("bad entry on free chain.");
        }
      }
      uVar4 = *(uint *)(Lisp_world + ptr);
      if (uVar4 == 0xe0001) {
        error("N_OP_createcell E0001 error");
        uVar4 = *(uint *)(pDVar6 + ptr);
      }
      *(uint *)((long)pDVar2 + uVar5 * 2 + (ulong)uVar7 + 8) = uVar4 & 0xfffffff;
      if ((uVar4 & 0x8000001) != 0) {
        error("bad entry on free chain.");
      }
      piVar1 = (int *)((long)pDVar2 + uVar5 * 2 + (ulong)uVar7 + 0x18);
      *piVar1 = *piVar1 + 1;
      pDVar6 = pDVar6 + ptr;
      for (uVar5 = (ulong)((uint)*(ushort *)((long)pDVar2 + uVar5 * 2 + (ulong)uVar7 + 4) * 2);
          uVar5 != 0; uVar5 = uVar5 - 2) {
        *(undefined2 *)((ulong)pDVar6 ^ 2) = 0;
        pDVar6 = pDVar6 + 1;
      }
      if (*(short *)((ulong)(ptr >> 8 & 0xfffffffe) + (long)MDStypetbl ^ 2) < 0) {
        return ptr;
      }
      if (*GcDisabled_word == 0x4c) {
        return ptr;
      }
      if (*Reclaim_cnt_word != 0) {
        htfind(ptr,1);
        return ptr;
      }
      rec_htfind(ptr,1);
      return ptr;
    }
  }
  MachineState.errorexit = 1;
  MachineState.tosvalue = tos;
  return 0xffffffff;
}

Assistant:

LispPTR N_OP_createcell(LispPTR tos) {
  struct dtd *dtd68k;
  DLword *ptr, *lastptr;
  LispPTR newcell;
  unsigned int type;

  if ((tos & SEGMASK) != S_POSITIVE) ERROR_EXIT(tos);
  type = tos & 0xffff;

#ifdef DTDDEBUG
  if (type == TYPE_LISTP) error("N_OP_createcell : Can't create Listp cell with CREATECELL");
  check_dtd_chain(type);
#endif

  dtd68k = (struct dtd *)GetDTD(type);

  oldoldfree = oldfree;
  oldfree = dtd68k->dtd_free;

  if (dtd68k->dtd_size == 0) ERROR_EXIT(tos);
/* error("OP_createcell : Attempt to create a cell not declared yet"); */

retry:
  if ((tos = newcell = ((dtd68k->dtd_free) & POINTERMASK)) != NIL) {
    ptr = (DLword *)NativeAligned2FromLAddr(newcell);
    if (917505 == *(LispPTR *)ptr) error("N_OP_createcell E0001 error");
    /* replace dtd_free with newcell's top DLword (it may keep next chain)*/
    dtd68k->dtd_free = (*((LispPTR *)ptr)) & POINTERMASK;
    if (dtd68k->dtd_free & 0x8000001) error("bad entry on free chain.");

    dtd68k->dtd_oldcnt++;

    /* clear 0  */
    for (lastptr = ptr + dtd68k->dtd_size; ptr != lastptr; ptr++) { GETWORD(ptr) = 0; }

    /*	 IncAllocCnt(1); */
    GCLOOKUP(tos, DELREF);
    return (tos);
  } else {
    dtd68k->dtd_free = initmdspage(alloc_mdspage(dtd68k->dtd_typeentry), dtd68k->dtd_size, NIL);
    if (dtd68k->dtd_free & 0x8000000) error("bad entry on free chain.");
    goto retry;
  }

}